

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O2

int nni_plat_file_delete(char *name)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = rmdir(name);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (iVar1 == 0x14) {
      iVar1 = unlink(name);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = *piVar2;
    }
    if (iVar1 != 2) {
      iVar1 = nni_plat_errno(iVar1);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int
nni_plat_file_delete(const char *name)
{
	if (rmdir(name) == 0) {
		return (0);
	}
	if ((errno == ENOTDIR) && (unlink(name) == 0)) {
		return (0);
	}
	if (errno == ENOENT) {
		return (0);
	}
	return (nni_plat_errno(errno));
}